

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall
TestParser_TestFunctionLiteral_Test::~TestParser_TestFunctionLiteral_Test
          (TestParser_TestFunctionLiteral_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestFunctionLiteral){
    cout << R"(
            ---- test_functionliteral ----

            )" << endl;
    string buff = R"( init fn = define (){}
                  )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(!program->Stmts.empty());
    EXPECT_EQ((int)program->Stmts.size(), 1);
    cout << program << endl;
}